

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::logMessage
          (MockExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  bool bVar1;
  String *params_7;
  char *__first;
  char *__last;
  String *in_stack_ffffffffffffff68;
  String local_58;
  StringPtr local_40;
  String *local_30;
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  MockExceptionCallback *pMStack_10;
  LogSeverity severity_local;
  MockExceptionCallback *this_local;
  
  local_30 = text;
  text_local._0_4_ = contextDepth;
  text_local._4_4_ = line;
  _contextDepth_local = file;
  file_local._4_4_ = severity;
  pMStack_10 = this;
  StringPtr::StringPtr(&local_40,"To symbolize stack traces, install it in your $PATH");
  bVar1 = String::contains(text,&local_40);
  if (!bVar1) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->text,"log message: ");
    params_7 = mv<kj::String>(local_30);
    str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
              (&local_58,(kj *)&contextDepth_local,(char **)0x31a226,
               (char (*) [2])((long)&text_local + 4),(int *)":+",(char (*) [3])&text_local,
               (int *)0x31d1c2,(char (*) [3])((long)&file_local + 4),(LogSeverity *)0x31d1c2,
               (char (*) [3])params_7,in_stack_ffffffffffffff68);
    String::operator=(local_30,&local_58);
    String::~String(&local_58);
    __first = String::begin(local_30);
    __last = String::end(local_30);
    ::std::__cxx11::string::append<char*,void>((string *)&this->text,__first,__last);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&this->text,"\n");
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    if (text.contains("To symbolize stack traces, install it in your $PATH")) {
      // Ignore warning about LLVM_SYMBOLIZER not being available.
      return;
    }

    this->text += "log message: ";
    text = str(file, ":", line, ":+", contextDepth, ": ", severity, ": ", mv(text));
    this->text.append(text.begin(), text.end());
    this->text.append("\n");
  }